

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::~ParamDict(ParamDict *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  ParamDictPrivate *unaff_retaddr;
  
  *in_RDI = &PTR__ParamDict_020154a8;
  pvVar1 = (void *)in_RDI[1];
  if (pvVar1 != (void *)0x0) {
    ParamDictPrivate::~ParamDictPrivate(unaff_retaddr);
    operator_delete(pvVar1,0xe00);
  }
  return;
}

Assistant:

ParamDict::~ParamDict()
{
    delete d;
}